

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O1

bool __thiscall QStackedLayout::hasHeightForWidth(QStackedLayout *this)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  
  iVar2 = (**(code **)(*(long *)&this->super_QLayout + 200))();
  bVar4 = 0 < iVar2;
  if (0 < iVar2) {
    iVar5 = 0;
    do {
      plVar3 = (long *)(**(code **)(*(long *)&this->super_QLayout + 0xa8))(this,iVar5);
      if ((plVar3 != (long *)0x0) && (cVar1 = (**(code **)(*plVar3 + 0x48))(plVar3), cVar1 != '\0'))
      {
        return bVar4;
      }
      iVar5 = iVar5 + 1;
      bVar4 = iVar5 < iVar2;
    } while (iVar5 != iVar2);
  }
  return bVar4;
}

Assistant:

bool QStackedLayout::hasHeightForWidth() const
{
    const int n = count();

    for (int i = 0; i < n; ++i) {
        if (QLayoutItem *item = itemAt(i)) {
            if (item->hasHeightForWidth())
                return true;
        }
    }
    return false;
}